

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressSeqStore_singleBlock
                 (ZSTD_CCtx *zc,seqStore_t *seqStore,repcodes_t *dRep,repcodes_t *cRep,void *dst,
                 size_t dstCapacity,void *src,size_t srcSize,U32 lastBlock,U32 isPartition)

{
  U32 UVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  repcodes_t dRepOriginal;
  size_t cSeqsSize;
  size_t cSize;
  BYTE *ip;
  BYTE *op;
  U32 rleMaxLength;
  size_t dstCapacity_local;
  void *dst_local;
  repcodes_t *cRep_local;
  repcodes_t *dRep_local;
  seqStore_t *seqStore_local;
  ZSTD_CCtx *zc_local;
  
  uVar2 = *(undefined8 *)dRep->rep;
  UVar1 = dRep->rep[2];
  if (isPartition != 0) {
    ZSTD_seqStore_resolveOffCodes
              (dRep,cRep,seqStore,
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3));
  }
  dRepOriginal.rep._4_8_ =
       ZSTD_entropyCompressSeqStore
                 (seqStore,&((zc->blockState).prevCBlock)->entropy,
                  &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,(void *)((long)dst + 3)
                  ,dstCapacity - 3,srcSize,zc->entropyWorkspace,0x19d8,zc->bmi2);
  uVar3 = ERR_isError(dRepOriginal.rep._4_8_);
  zc_local = (ZSTD_CCtx *)dRepOriginal.rep._4_8_;
  if (uVar3 == 0) {
    if (((zc->isFirstBlock == 0) && ((ulong)dRepOriginal.rep._4_8_ < (ZSTD_CCtx *)0x19)) &&
       (iVar4 = ZSTD_isRLE((BYTE *)src,srcSize), iVar4 != 0)) {
      dRepOriginal.rep[1] = 1;
      dRepOriginal.rep[2] = 0;
    }
    if ((zc->seqCollector).collectSequences == 0) {
      if ((((zc->blockState).prevCBlock)->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
        (((zc->blockState).prevCBlock)->entropy).fse.offcode_repeatMode = FSE_repeat_check;
      }
      if (dRepOriginal.rep._4_8_ == 0) {
        cSeqsSize = ZSTD_noCompressBlock(dst,dstCapacity,src,srcSize,lastBlock);
        uVar3 = ERR_isError(cSeqsSize);
        if (uVar3 != 0) {
          return cSeqsSize;
        }
        *(undefined8 *)dRep->rep = uVar2;
        dRep->rep[2] = UVar1;
      }
      else if (dRepOriginal.rep._4_8_ == 1) {
        cSeqsSize = ZSTD_rleCompressBlock(dst,dstCapacity,*src,srcSize,lastBlock);
        uVar3 = ERR_isError(cSeqsSize);
        if (uVar3 != 0) {
          return cSeqsSize;
        }
        *(undefined8 *)dRep->rep = uVar2;
        dRep->rep[2] = UVar1;
      }
      else {
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        writeBlockHeader(dst,dRepOriginal.rep._4_8_,srcSize,lastBlock);
        cSeqsSize = dRepOriginal.rep._4_8_ + 3;
      }
      zc_local = (ZSTD_CCtx *)cSeqsSize;
    }
    else {
      ZSTD_copyBlockSequences(zc);
      ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
      zc_local = (ZSTD_CCtx *)0x0;
    }
  }
  return (size_t)zc_local;
}

Assistant:

static size_t ZSTD_compressSeqStore_singleBlock(ZSTD_CCtx* zc, seqStore_t* const seqStore,
                                                repcodes_t* const dRep, repcodes_t* const cRep,
                                                void* dst, size_t dstCapacity,
                                                const void* src, size_t srcSize,
                                                U32 lastBlock, U32 isPartition) {
    const U32 rleMaxLength = 25;
    BYTE* op = (BYTE*)dst;
    const BYTE* ip = (const BYTE*)src;
    size_t cSize;
    size_t cSeqsSize;

    /* In case of an RLE or raw block, the simulated decompression repcode history must be reset */
    repcodes_t const dRepOriginal = *dRep;
    if (isPartition)
        ZSTD_seqStore_resolveOffCodes(dRep, cRep, seqStore, (U32)(seqStore->sequences - seqStore->sequencesStart));

    cSeqsSize = ZSTD_entropyCompressSeqStore(seqStore,
                &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
                &zc->appliedParams,
                op + ZSTD_blockHeaderSize, dstCapacity - ZSTD_blockHeaderSize,
                srcSize,
                zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
                zc->bmi2);
    FORWARD_IF_ERROR(cSeqsSize, "ZSTD_entropyCompressSeqStore failed!");

    if (!zc->isFirstBlock &&
        cSeqsSize < rleMaxLength &&
        ZSTD_isRLE((BYTE const*)src, srcSize)) {
        /* We don't want to emit our first block as a RLE even if it qualifies because
        * doing so will cause the decoder (cli only) to throw a "should consume all input error."
        * This is only an issue for zstd <= v1.4.3
        */
        cSeqsSize = 1;
    }

    if (zc->seqCollector.collectSequences) {
        ZSTD_copyBlockSequences(zc);
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        return 0;
    }

    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    if (cSeqsSize == 0) {
        cSize = ZSTD_noCompressBlock(op, dstCapacity, ip, srcSize, lastBlock);
        FORWARD_IF_ERROR(cSize, "Nocompress block failed");
        DEBUGLOG(4, "Writing out nocompress block, size: %zu", cSize);
        *dRep = dRepOriginal; /* reset simulated decompression repcode history */
    } else if (cSeqsSize == 1) {
        cSize = ZSTD_rleCompressBlock(op, dstCapacity, *ip, srcSize, lastBlock);
        FORWARD_IF_ERROR(cSize, "RLE compress block failed");
        DEBUGLOG(4, "Writing out RLE block, size: %zu", cSize);
        *dRep = dRepOriginal; /* reset simulated decompression repcode history */
    } else {
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        writeBlockHeader(op, cSeqsSize, srcSize, lastBlock);
        cSize = ZSTD_blockHeaderSize + cSeqsSize;
        DEBUGLOG(4, "Writing out compressed block, size: %zu", cSize);
    }
    return cSize;
}